

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

int port_from_container(char *container_id,char **port_out)

{
  int iVar1;
  char *pcVar2;
  char **port_out_local;
  char *container_id_local;
  
  iVar1 = is_running_inside_a_container();
  if (iVar1 == 0) {
    container_id_local._4_4_ =
         run_command(port_out,
                     "docker inspect --format \"{{ index (index (index .NetworkSettings.Ports \\\"22/tcp\\\") 0) \\\"HostPort\\\" }}\" %s"
                     ,container_id);
  }
  else {
    pcVar2 = strdup("22");
    *port_out = pcVar2;
    container_id_local._4_4_ = 0;
  }
  return container_id_local._4_4_;
}

Assistant:

static int port_from_container(char *container_id, char **port_out)
{
    if(is_running_inside_a_container()) {
        *port_out = strdup("22");
        return 0;
    }
    else {
        return run_command(port_out,
                           "docker inspect --format "
                           "\"{{ index (index (index .NetworkSettings.Ports "
                           "\\\"22/tcp\\\") 0) \\\"HostPort\\\" }}\" %s",
                           container_id);
    }
}